

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

bool comparesEqual(QString *lhs,QByteArrayView rhs)

{
  int iVar1;
  QChar *pQVar2;
  qsizetype qVar3;
  const_pointer pvVar4;
  qsizetype qVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QString::constData((QString *)0x1414ff);
  qVar3 = QString::size(in_RDI);
  pvVar4 = QByteArrayView::constData((QByteArrayView *)0x141521);
  qVar5 = QByteArrayView::size(&local_18);
  iVar1 = QString::compare_helper(pQVar2,qVar3,pvVar4,qVar5,CaseSensitive);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

friend bool comparesEqual(const QString &lhs, QByteArrayView rhs) noexcept
    {
        return QString::compare_helper(lhs.constData(), lhs.size(),
                                       rhs.constData(), rhs.size()) == 0;
    }